

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O3

void qDrawWinPanel(QPainter *p,int x,int y,int w,int h,QPalette *pal,bool sunken,QBrush *fill)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  ColorGroup CVar5;
  
  CVar5 = (ColorGroup)pal;
  plVar4 = (long *)QPalette::brush(CVar5,Dark);
  lVar1 = *plVar4;
  plVar4 = (long *)QPalette::brush(CVar5,Dark);
  lVar2 = *plVar4;
  plVar4 = (long *)QPalette::brush(CVar5,Dark);
  lVar3 = *plVar4;
  plVar4 = (long *)QPalette::brush(CVar5,Dark);
  qDrawWinShades(p,x,y,w,h,(QColor *)(lVar1 + 8),(QColor *)(lVar2 + 8),(QColor *)(lVar3 + 8),
                 (QColor *)(*plVar4 + 8),fill);
  return;
}

Assistant:

void qDrawWinPanel(QPainter *p, int x, int y, int w, int h,
                    const QPalette &pal, bool        sunken,
                    const QBrush *fill)
{
    if (sunken)
        qDrawWinShades(p, x, y, w, h,
                        pal.dark().color(), pal.light().color(), pal.shadow().color(),
                       pal.midlight().color(), fill);
    else
        qDrawWinShades(p, x, y, w, h,
                       pal.light().color(), pal.shadow().color(), pal.midlight().color(),
                       pal.dark().color(), fill);
}